

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

lys_module * lys_parse_path(ly_ctx *ctx,char *path,LYS_INFORMAT format)

{
  undefined8 uVar1;
  int iVar2;
  lys_module *plVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  size_t __n;
  char *pcVar7;
  int *piVar8;
  char *pcVar9;
  char local_1048 [8];
  char rpath [4096];
  
  if (ctx == (ly_ctx *)0x0 || path == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_parse_path");
    return (lys_module *)0x0;
  }
  iVar2 = open(path,0);
  if (iVar2 == -1) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    ly_log(ctx,LY_LLERR,LY_ESYS,"Opening file \"%s\" failed (%s).",path,pcVar9);
    return (lys_module *)0x0;
  }
  plVar3 = lys_parse_fd_(ctx,iVar2,format,(char *)0x0,1);
  close(iVar2);
  if (plVar3 == (lys_module *)0x0) {
    return (lys_module *)0x0;
  }
  pcVar4 = strrchr(path,0x2f);
  pcVar9 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    pcVar9 = path;
  }
  pcVar5 = strchr(pcVar9,0x40);
  pcVar6 = strrchr(pcVar9,0x2e);
  pcVar4 = plVar3->name;
  rpath._4088_8_ = plVar3;
  __n = strlen(pcVar4);
  iVar2 = strncmp(pcVar9,pcVar4,__n);
  if (iVar2 == 0) {
    pcVar7 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      pcVar7 = pcVar6;
    }
    if (pcVar9 + __n != pcVar7) goto LAB_0015c04f;
  }
  else {
LAB_0015c04f:
    ly_log(ctx,LY_LLWRN,LY_SUCCESS,"File name \"%s\" does not match module name \"%s\".",pcVar9,
           pcVar4);
  }
  uVar1 = rpath._4088_8_;
  if (pcVar5 != (char *)0x0) {
    if ((*(char *)(rpath._4088_8_ + 0x44) == '\0') || ((long)pcVar6 - (long)(pcVar5 + 1) != 10)) {
      if (*(char *)(rpath._4088_8_ + 0x44) == '\0') {
        pcVar4 = "none";
      }
      else {
        pcVar4 = *(char **)(rpath._4088_8_ + 0x58);
      }
    }
    else {
      pcVar4 = *(char **)(rpath._4088_8_ + 0x58);
      iVar2 = strncmp(pcVar4,pcVar5 + 1,10);
      if (iVar2 == 0) goto LAB_0015c134;
    }
    ly_log(ctx,LY_LLWRN,LY_SUCCESS,"File name \"%s\" does not match module revision \"%s\".",pcVar9,
           pcVar4);
  }
LAB_0015c134:
  if (*(long *)(uVar1 + 0x38) == 0) {
    pcVar4 = realpath(path,local_1048);
    pcVar9 = local_1048;
    if (pcVar4 == (char *)0x0) {
      pcVar9 = path;
    }
    pcVar9 = lydict_insert(ctx,pcVar9,0);
    *(char **)(uVar1 + 0x38) = pcVar9;
  }
  return (lys_module *)uVar1;
}

Assistant:

lys_module *
lys_parse_path(struct ly_ctx *ctx, const char *path, LYS_INFORMAT format)
{
    int fd;
    const struct lys_module *ret;
    const char *rev, *dot, *filename;
    size_t len;

    if (!ctx || !path) {
        LOGARG;
        return NULL;
    }

    fd = open(path, O_RDONLY);
    if (fd == -1) {
        LOGERR(ctx, LY_ESYS, "Opening file \"%s\" failed (%s).", path, strerror(errno));
        return NULL;
    }

    ret = lys_parse_fd(ctx, fd, format);
    close(fd);

    if (!ret) {
        /* error */
        return NULL;
    }

    /* check that name and revision match filename */
    filename = strrchr(path, '/');
    if (!filename) {
        filename = path;
    } else {
        filename++;
    }
    rev = strchr(filename, '@');
    dot = strrchr(filename, '.');

    /* name */
    len = strlen(ret->name);
    if (strncmp(filename, ret->name, len) ||
            ((rev && rev != &filename[len]) || (!rev && dot != &filename[len]))) {
        LOGWRN(ctx, "File name \"%s\" does not match module name \"%s\".", filename, ret->name);
    }
    if (rev) {
        len = dot - ++rev;
        if (!ret->rev_size || len != 10 || strncmp(ret->rev[0].date, rev, len)) {
            LOGWRN(ctx, "File name \"%s\" does not match module revision \"%s\".", filename,
                   ret->rev_size ? ret->rev[0].date : "none");
        }
    }

    if (!ret->filepath) {
        /* store URI */
        char rpath[PATH_MAX];
        if (realpath(path, rpath) != NULL) {
            ((struct lys_module *)ret)->filepath = lydict_insert(ctx, rpath, 0);
        } else {
            ((struct lys_module *)ret)->filepath = lydict_insert(ctx, path, 0);
        }
    }

    return ret;
}